

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractValues.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  CaseValues *pCVar1;
  deBool dVar2;
  char *pcVar3;
  size_t sVar4;
  runtime_error *this;
  long *plVar5;
  long *plVar6;
  int iVar7;
  NumericValue *value;
  long lVar8;
  ulong uVar9;
  pointer pbVar10;
  bool bVar11;
  bool bVar12;
  CommandLine cmdLine;
  ifstream in;
  TagParser resultHandler;
  TestLogParser parser;
  deUint8 buf [1024];
  char *local_9b8;
  long local_9b0;
  char local_9a8;
  undefined7 uStack_9a7;
  undefined1 local_998 [24];
  char local_980;
  BatchResultValues local_978;
  long *local_948;
  long local_940;
  long local_938;
  long lStack_930;
  long *local_928;
  long local_920;
  long local_918;
  long lStack_910;
  undefined1 *local_908 [2];
  undefined1 local_8f8 [16];
  long local_8e8 [4];
  int aiStack_8c8 [122];
  TestLogHandler local_6e0;
  BatchResultValues *local_6d8;
  TestResultParser local_6d0;
  TestLogParser local_5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438 [32];
  
  local_9b8 = &local_9a8;
  local_9b0 = 0;
  local_9a8 = '\0';
  local_998._0_8_ = (pointer)0x0;
  local_998[8] = 0;
  local_998._9_7_ = 0;
  local_998[0x10] = 0;
  stack0xfffffffffffff679 = 0;
  if (1 < argc) {
    bVar11 = true;
    uVar9 = 2;
    do {
      pcVar3 = argv[uVar9 - 1];
      dVar2 = deStringEqual(pcVar3,"--statuscode");
      if (dVar2 == 0) {
        dVar2 = deStringBeginsWith(pcVar3,"--");
        if (dVar2 != 0) {
          if (!bVar11 && local_9b0 != 0) goto LAB_0010b712;
          goto LAB_0010b9c2;
        }
        if (local_9b0 == 0) {
          strlen(pcVar3);
          std::__cxx11::string::_M_replace((ulong)&local_9b8,0,(char *)0x0,(ulong)pcVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_438,pcVar3,(allocator<char> *)local_8e8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_998,
                     local_438);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
            operator_delete(local_438[0]._M_dataplus._M_p,
                            local_438[0].field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        stack0xfffffffffffff679 = CONCAT17(1,local_998._17_7_);
      }
      bVar11 = uVar9 < (uint)argc;
      bVar12 = uVar9 != (uint)argc;
      uVar9 = uVar9 + 1;
    } while (bVar12);
  }
  if (local_9b0 == 0) {
LAB_0010b9c2:
    printf("%s: [filename] [name 1] [[name 2]...]\n",*argv);
    puts(" --statuscode     Include status code as first entry.");
    iVar7 = -1;
  }
  else {
LAB_0010b712:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_978.m_tagNames,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_998);
    local_978.m_caseValues.super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_978.m_caseValues.super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_978.m_caseValues.super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::ifstream::ifstream(local_8e8,local_9b8,_S_in|_S_bin);
    local_6e0._vptr_TestLogHandler = (_func_int **)&PTR__TagParser_0011b0a0;
    local_6d8 = &local_978;
    xe::TestResultParser::TestResultParser(&local_6d0);
    xe::TestLogParser::TestLogParser(&local_5a8,&local_6e0);
    if (*(int *)((long)aiStack_8c8 + *(long *)(local_8e8[0] + -0x18)) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      local_908[0] = local_8f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_908,"Failed to open \'","");
      plVar5 = (long *)std::__cxx11::string::append((char *)local_908);
      local_948 = (long *)*plVar5;
      plVar6 = plVar5 + 2;
      if (local_948 == plVar6) {
        local_938 = *plVar6;
        lStack_930 = plVar5[3];
        local_948 = &local_938;
      }
      else {
        local_938 = *plVar6;
      }
      local_940 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_948);
      local_928 = (long *)*plVar5;
      plVar6 = plVar5 + 2;
      if (local_928 == plVar6) {
        local_918 = *plVar6;
        lStack_910 = plVar5[3];
        local_928 = &local_918;
      }
      else {
        local_918 = *plVar6;
      }
      local_920 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::runtime_error::runtime_error(this,(string *)&local_928);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    while( true ) {
      std::istream::read((char *)local_8e8,(long)local_438);
      if ((int)(uint)local_8e8[1] < 1) break;
      xe::TestLogParser::parse
                (&local_5a8,(deUint8 *)local_438,(ulong)((uint)local_8e8[1] & 0x7fffffff));
    }
    std::ifstream::close();
    xe::TestLogParser::~TestLogParser(&local_5a8);
    local_6e0._vptr_TestLogHandler = (_func_int **)&PTR__TagParser_0011b0a0;
    xe::TestResultParser::~TestResultParser(&local_6d0);
    std::ifstream::~ifstream(local_8e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CasePath",8);
    if (local_980 == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",StatusCode",0xb);
    }
    pbVar10 = local_978.m_tagNames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_978.m_tagNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_978.m_tagNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 !=
               local_978.m_tagNames.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    if (0 < (int)((ulong)((long)local_978.m_caseValues.
                                super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_978.m_caseValues.
                               super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3)) {
      lVar8 = 0;
      do {
        pCVar1 = local_978.m_caseValues.
                 super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8];
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(pCVar1->casePath)._M_dataplus._M_p,
                   (pCVar1->casePath)._M_string_length);
        if (local_980 == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
          pcVar3 = xe::getTestStatusCodeName(pCVar1->statusCode);
          if (pcVar3 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x11d160);
          }
          else {
            sVar4 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar4);
          }
        }
        for (value = (pCVar1->values).
                     super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            value != (pCVar1->values).
                     super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>
                     ._M_impl.super__Vector_impl_data._M_finish; value = value + 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
          xe::ri::operator<<((ostream *)&std::cout,value);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        lVar8 = lVar8 + 1;
      } while (lVar8 < (int)((ulong)((long)local_978.m_caseValues.
                                           super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_978.m_caseValues.
                                          super__Vector_base<CaseValues_*,_std::allocator<CaseValues_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3));
    }
    BatchResultValues::~BatchResultValues(&local_978);
    iVar7 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_998);
  if (local_9b8 != &local_9a8) {
    operator_delete(local_9b8,CONCAT71(uStack_9a7,local_9a8) + 1);
  }
  return iVar7;
}

Assistant:

int main (int argc, const char* const* argv)
{
	try
	{
		CommandLine cmdLine;

		if (!parseCommandLine(cmdLine, argc, argv))
		{
			printHelp(argv[0]);
			return -1;
		}

		printTaggedValues(cmdLine, std::cout);
	}
	catch (const std::exception& e)
	{
		printf("FATAL ERROR: %s\n", e.what());
		return -1;
	}

	return 0;
}